

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall CVmObjLookupTable::mark_undo_ref(CVmObjLookupTable *this,CVmUndoRecord *undo_rec)

{
  CVmObjTable *in_RSI;
  lookuptab_undo_rec *rec;
  CVmObjGlobPage *pCVar1;
  
  pCVar1 = in_RSI->globals_;
  if ((int)pCVar1->used_ == 5) {
    CVmObjTable::mark_all_refs(in_RSI,(vm_obj_id_t)((ulong)pCVar1 >> 0x20),(uint)pCVar1);
  }
  if (*(int *)&in_RSI->global_var_head_ == 5) {
    CVmObjTable::mark_all_refs(in_RSI,(vm_obj_id_t)((ulong)pCVar1 >> 0x20),(uint)pCVar1);
  }
  return;
}

Assistant:

void CVmObjLookupTable::
   mark_undo_ref(VMG_ struct CVmUndoRecord *undo_rec)
{
    lookuptab_undo_rec *rec;

    /* get our private record from the standard undo record */
    rec = (lookuptab_undo_rec *)undo_rec->id.ptrval;

    /* if the key in the record is an object, mark it referenced */
    if (rec->key.typ == VM_OBJ)
        G_obj_table->mark_all_refs(rec->key.val.obj, VMOBJ_REACHABLE);

    /* if the value in the record is an object, mark it as well */
    if (undo_rec->oldval.typ == VM_OBJ)
        G_obj_table->mark_all_refs(undo_rec->oldval.val.obj,
                                   VMOBJ_REACHABLE);
}